

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

void __thiscall cmGeneratorTarget::AddSource(cmGeneratorTarget *this,string *src)

{
  pointer *pppTVar1;
  iterator __position;
  auto_ptr<cmCompiledGeneratorExpression> aVar2;
  cmCompiledGeneratorExpression *x;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  cmGeneratorExpression ge;
  cmListFileBacktrace lfbt;
  auto_ptr<cmCompiledGeneratorExpression> local_b0;
  undefined1 local_a8 [80];
  cmListFileBacktrace local_58;
  
  cmTarget::AddSource(this->Target,src);
  cmMakefile::GetBacktrace(&local_58,this->Makefile);
  cmGeneratorExpression::cmGeneratorExpression((cmGeneratorExpression *)(local_a8 + 0x10),&local_58)
  ;
  cmGeneratorExpression::Parse((cmGeneratorExpression *)local_a8,(string *)(local_a8 + 0x10));
  local_b0.x_ = (cmCompiledGeneratorExpression *)local_a8._0_8_;
  local_a8._0_8_ = (pointer)0x0;
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)local_a8);
  aVar2.x_ = local_b0.x_;
  (local_b0.x_)->EvaluateForBuildsystem = true;
  local_a8._0_8_ = operator_new(0x10);
  local_b0.x_ = (cmCompiledGeneratorExpression *)0x0;
  local_a8._8_8_ = 0;
  (((TargetPropertyEntry *)local_a8._0_8_)->ge).x_ = aVar2.x_;
  ((TargetPropertyEntry *)local_a8._0_8_)->LinkImplItem = &TargetPropertyEntry::NoLinkImplItem;
  __position._M_current =
       (this->SourceEntries).
       super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->SourceEntries).
      super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<cmGeneratorTarget::TargetPropertyEntry*,std::allocator<cmGeneratorTarget::TargetPropertyEntry*>>
    ::_M_realloc_insert<cmGeneratorTarget::TargetPropertyEntry*>
              ((vector<cmGeneratorTarget::TargetPropertyEntry*,std::allocator<cmGeneratorTarget::TargetPropertyEntry*>>
                *)&this->SourceEntries,__position,(TargetPropertyEntry **)local_a8);
  }
  else {
    *__position._M_current = (TargetPropertyEntry *)local_a8._0_8_;
    pppTVar1 = &(this->SourceEntries).
                super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppTVar1 = *pppTVar1 + 1;
  }
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)(local_a8 + 8));
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
  ::clear(&(this->SourceFilesMap)._M_t);
  this->LinkImplementationLanguageIsContextDependent = true;
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_b0);
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)(local_a8 + 0x10));
  cmListFileBacktrace::~cmListFileBacktrace(&local_58);
  return;
}

Assistant:

void cmGeneratorTarget::AddSource(const std::string& src)
{
  this->Target->AddSource(src);
  cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
  cmGeneratorExpression ge(lfbt);
  cmsys::auto_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(src);
  cge->SetEvaluateForBuildsystem(true);
  this->SourceEntries.push_back(
                        new TargetPropertyEntry(cge));
  this->SourceFilesMap.clear();
  this->LinkImplementationLanguageIsContextDependent = true;
}